

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O1

Gia_Man_t * Gia_SweeperStart(Gia_Man_t *pGia)

{
  Vec_Int_t *p;
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  sat_solver *s;
  int Fill;
  long lVar6;
  int Lit;
  timespec ts;
  uint local_3c;
  timespec local_38;
  
  if (pGia == (Gia_Man_t *)0x0) {
    pGia = Gia_ManStart(10000);
  }
  if (pGia->pHTable == (int *)0x0) {
    Gia_ManHashStart(pGia);
  }
  if (pGia->pHTable == (int *)0x0) {
    __assert_fail("pGia->pHTable != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                  ,0x6f,"Swp_Man_t *Swp_ManStart(Gia_Man_t *)");
  }
  puVar3 = (undefined8 *)calloc(1,0xa8);
  pGia->pData = puVar3;
  *puVar3 = pGia;
  *(undefined4 *)(puVar3 + 1) = 1000;
  puVar4 = (undefined8 *)malloc(0x10);
  *puVar4 = 100;
  pvVar5 = malloc(400);
  puVar4[1] = pvVar5;
  puVar3[2] = puVar4;
  puVar4 = (undefined8 *)malloc(0x10);
  *puVar4 = 100;
  pvVar5 = malloc(400);
  puVar4[1] = pvVar5;
  puVar3[3] = puVar4;
  puVar4 = (undefined8 *)malloc(0x10);
  *puVar4 = 100;
  pvVar5 = malloc(400);
  puVar4[1] = pvVar5;
  puVar3[4] = puVar4;
  puVar4 = (undefined8 *)malloc(0x10);
  *puVar4 = 10000;
  pvVar5 = malloc(40000);
  puVar4[1] = pvVar5;
  puVar3[6] = puVar4;
  puVar4 = (undefined8 *)malloc(0x10);
  *puVar4 = 100;
  pvVar5 = malloc(400);
  puVar4[1] = pvVar5;
  puVar3[7] = puVar4;
  puVar4 = (undefined8 *)malloc(0x10);
  *puVar4 = 100;
  pvVar5 = malloc(400);
  puVar4[1] = pvVar5;
  puVar3[8] = puVar4;
  puVar4 = (undefined8 *)malloc(0x10);
  *puVar4 = 100;
  pvVar5 = malloc(400);
  puVar4[1] = pvVar5;
  puVar3[9] = puVar4;
  s = sat_solver_new();
  puVar3[5] = s;
  *(undefined4 *)(puVar3 + 0xb) = 1;
  sat_solver_setnvars(s,1000);
  iVar2 = *(int *)(puVar3 + 0xb);
  *(int *)(puVar3 + 0xb) = iVar2 + 1;
  if (iVar2 < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  uVar1 = iVar2 * 2;
  local_3c = uVar1;
  if (iVar2 != 0) {
    p = (Vec_Int_t *)puVar3[6];
    Vec_IntFillExtra(p,1,Fill);
    if (p->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *p->pArray = uVar1;
    if (-1 < (int)local_3c) {
      local_3c = local_3c ^ 1;
      sat_solver_addclause((sat_solver *)puVar3[5],(lit *)&local_3c,(lit *)&local_38);
      iVar2 = clock_gettime(3,&local_38);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      puVar3[0xe] = lVar6;
      pGia->fSweeper = 1;
      return pGia;
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10e,"int Abc_LitNot(int)");
  }
  __assert_fail("Lit > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                ,0x5a,"void Swp_ManSetObj2Lit(Swp_Man_t *, int, int)");
}

Assistant:

Gia_Man_t * Gia_SweeperStart( Gia_Man_t * pGia )
{
    if ( pGia == NULL )
        pGia = Gia_ManStart( 10000 );
    if ( pGia->pHTable == NULL )
        Gia_ManHashStart( pGia );
    // recompute fPhase and fMark1 to mark multiple fanout nodes if AIG is already defined!!!

    Swp_ManStart( pGia );
    pGia->fSweeper = 1;
    return pGia;
}